

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

bool operator==(SettingsValue *a,SettingsValue *b)

{
  __type_conflict _Var1;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::write_abi_cxx11_((UniValue *)&stack0xffffffffffffffc0,(int)a,(void *)0x0,0);
  UniValue::write_abi_cxx11_((UniValue *)&local_60,(int)b,(void *)0x0,0);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffffc0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return _Var1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool operator==(const common::SettingsValue& a, const common::SettingsValue& b)
{
    return a.write() == b.write();
}